

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_dispatch.c
# Opt level: O2

void blake3_compress_xof(uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,
                        uint8_t flags,uint8_t *out)

{
  cpu_feature cVar1;
  
  cVar1 = get_cpu_features();
  if ((cVar1 & SSE41) == 0) {
    blake3_compress_xof_portable(cv,block,block_len,counter,flags,out);
    return;
  }
  blake3_compress_xof_sse41(cv,block,block_len,counter,flags,out);
  return;
}

Assistant:

void blake3_compress_xof(const uint32_t cv[8],
                        const uint8_t block[BLAKE3_BLOCK_LEN],
                        uint8_t block_len, uint64_t counter,
                        uint8_t flags, uint8_t out[64])
{
    const enum cpu_feature features = get_cpu_features();
#if defined(IS_X86)
#ifdef BLAKE3_USE_AVX512
    if(features & AVX512VL) {
        blake3_compress_xof_avx512(cv, block, block_len, counter, flags, out);
        return;
    }
#endif
    if(features & SSE41) {
        blake3_compress_xof_sse41(cv, block, block_len, counter, flags, out);
        return;
    }
#endif
    blake3_compress_xof_portable(cv, block, block_len, counter, flags, out);
}